

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cc
# Opt level: O0

bool __thiscall ToOpEdge::operator<(ToOpEdge *this,ToOpEdge *op2)

{
  bool bVar1;
  uintm uVar2;
  uintm uVar3;
  SeqNum *pSVar4;
  Address *this_00;
  Address *op2_00;
  uintm ord2;
  uintm ord1;
  Address *addr2;
  Address *addr1;
  ToOpEdge *op2_local;
  ToOpEdge *this_local;
  
  pSVar4 = PcodeOp::getSeqNum(this->op);
  this_00 = SeqNum::getAddr(pSVar4);
  pSVar4 = PcodeOp::getSeqNum(op2->op);
  op2_00 = SeqNum::getAddr(pSVar4);
  bVar1 = Address::operator!=(this_00,op2_00);
  if (bVar1) {
    this_local._7_1_ = Address::operator<(this_00,op2_00);
  }
  else {
    pSVar4 = PcodeOp::getSeqNum(this->op);
    uVar2 = SeqNum::getOrder(pSVar4);
    pSVar4 = PcodeOp::getSeqNum(op2->op);
    uVar3 = SeqNum::getOrder(pSVar4);
    if (uVar2 == uVar3) {
      this_local._7_1_ = this->slot < op2->slot;
    }
    else {
      this_local._7_1_ = uVar2 < uVar3;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ToOpEdge::operator<(const ToOpEdge &op2) const

{
  const Address &addr1( op->getSeqNum().getAddr() );
  const Address &addr2( op2.op->getSeqNum().getAddr() );
  if (addr1 != addr2)
    return (addr1 < addr2);
  uintm ord1 = op->getSeqNum().getOrder();
  uintm ord2 = op2.op->getSeqNum().getOrder();
  if (ord1 != ord2)
    return (ord1 < ord2);
  return (slot < op2.slot);
}